

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void * __thiscall
google::protobuf::anon_unknown_1::TableArena::AllocRawInternal
          (TableArena *this,uint32_t size,Tag tag)

{
  pointer *ppRVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  Block *pBVar5;
  ulong uVar6;
  pointer pRVar7;
  LogMessage *pLVar8;
  undefined7 in_register_00000011;
  uint uVar9;
  pointer __src;
  ulong uVar10;
  Block *res;
  Block *to_relocate;
  ulong uVar11;
  LogFinisher local_81;
  pointer local_80;
  undefined4 local_74;
  size_t local_70;
  LogMessage local_68;
  
  local_74 = (undefined4)CONCAT71(in_register_00000011,tag);
  uVar9 = size + 7 & 0xfffffff8;
  lVar4 = 0;
  do {
    if (lVar4 == 6) {
      to_relocate = this->current_;
      if ((to_relocate == (Block *)0x0) ||
         ((uint)to_relocate->end_offset - (uint)to_relocate->start_offset <= uVar9)) {
        pBVar5 = (Block *)operator_new(0x1000);
        pBVar5->start_offset = 0;
        pBVar5->end_offset = 0xff0;
        pBVar5->capacity = 0xff0;
        pBVar5->next = (Block *)0x0;
        this->current_ = pBVar5;
        if (0xfef < size + 7) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x349);
          pLVar8 = internal::LogMessage::operator<<
                             (&local_68,"CHECK failed: (current_->space_left()) >= (size + 1): ");
          internal::LogFinisher::operator=(&local_81,pLVar8);
          internal::LogMessage::~LogMessage(&local_68);
        }
      }
      else {
        pBVar5 = to_relocate;
        to_relocate = (Block *)0x0;
      }
LAB_0036c1f3:
      this->num_allocations_ = this->num_allocations_ + 1;
      __src = (this->rollback_info_).
              super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pRVar7 = (this->rollback_info_).
               super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((__src == pRVar7) || (pRVar7[-1].block != pBVar5)) {
        if (pRVar7 == (this->rollback_info_).
                      super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_70 = (long)pRVar7 - (long)__src;
          if (local_70 == 0x7ffffffffffffff0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar11 = (long)local_70 >> 4;
          uVar6 = 1;
          if (__src != pRVar7) {
            uVar6 = uVar11;
          }
          uVar10 = uVar6 + uVar11;
          if (0x7fffffffffffffe < uVar10) {
            uVar10 = 0x7ffffffffffffff;
          }
          if (CARRY8(uVar6,uVar11)) {
            uVar10 = 0x7ffffffffffffff;
          }
          if (uVar10 == 0) {
            pRVar7 = (pointer)0x0;
          }
          else {
            local_80 = __src;
            pRVar7 = (pointer)operator_new(uVar10 << 4);
            __src = local_80;
          }
          pRVar7[uVar11].block = pBVar5;
          pRVar7[uVar11].count = 1;
          local_80 = pRVar7;
          if (0 < (long)local_70) {
            memmove(pRVar7,__src,local_70);
          }
          pRVar7 = (pointer)((long)&local_80[1].block + local_70);
          if (__src != (pointer)0x0) {
            operator_delete(__src);
          }
          (this->rollback_info_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
          ._M_impl.super__Vector_impl_data._M_start = local_80;
          (this->rollback_info_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pRVar7;
          (this->rollback_info_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_80 + uVar10;
        }
        else {
          pRVar7->block = pBVar5;
          pRVar7->count = 1;
          ppRVar1 = &(this->rollback_info_).
                     super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppRVar1 = *ppRVar1 + 1;
        }
      }
      else {
        pRVar7[-1].count = pRVar7[-1].count + 1;
      }
      uVar2 = pBVar5->end_offset;
      uVar3 = pBVar5->start_offset;
      if ((uint)uVar2 - (uint)uVar3 <= uVar9) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x3cb);
        pLVar8 = internal::LogMessage::operator<<
                           (&local_68,"CHECK failed: (n + 1) <= (space_left()): ");
        internal::LogFinisher::operator=(&local_81,pLVar8);
        internal::LogMessage::~LogMessage(&local_68);
        uVar3 = pBVar5->start_offset;
        uVar2 = pBVar5->end_offset;
      }
      pBVar5->start_offset = (short)uVar9 + uVar3;
      pBVar5->end_offset = uVar2 - 1;
      *(char *)((long)&pBVar5[1].start_offset + (ulong)(ushort)(uVar2 - 1)) = (char)local_74;
      if (to_relocate != (Block *)0x0) {
        RelocateToUsedList(this,to_relocate);
      }
      return (void *)((long)&pBVar5[1].start_offset + (ulong)uVar3);
    }
    pBVar5 = (this->small_size_blocks_)._M_elems[lVar4];
    if ((pBVar5 != (Block *)0x0) &&
       (uVar9 <= (byte)(&(anonymous_namespace)::TableArena::kSmallSizes)[lVar4])) {
      (this->small_size_blocks_)._M_elems[lVar4] = pBVar5->next;
      to_relocate = pBVar5;
      goto LAB_0036c1f3;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void* AllocRawInternal(uint32_t size, Tag tag) {
    GOOGLE_DCHECK_GT(size, 0);
    size = RoundUp(size);

    Block* to_relocate = nullptr;
    Block* to_use = nullptr;

    for (size_t i = 0; i < kSmallSizes.size(); ++i) {
      if (small_size_blocks_[i] != nullptr && size <= kSmallSizes[i]) {
        to_use = to_relocate = PopBlock(small_size_blocks_[i]);
        break;
      }
    }

    if (to_relocate != nullptr) {
      // We found one in the loop.
    } else if (current_ != nullptr && size + 1 <= current_->space_left()) {
      to_use = current_;
    } else {
      // No space left anywhere, make a new block.
      to_relocate = current_;
      // For now we hardcode the size to one page. Note that the maximum we can
      // allocate in the block according to the limits of Tag is less than 2k,
      // so this can fit anything that Tag can represent.
      constexpr size_t kBlockSize = 4096;
      to_use = current_ = ::new (::operator new(kBlockSize)) Block(kBlockSize);
      GOOGLE_DCHECK_GE(current_->space_left(), size + 1);
    }

    ++num_allocations_;
    if (!rollback_info_.empty() && rollback_info_.back().block == to_use) {
      ++rollback_info_.back().count;
    } else {
      rollback_info_.push_back({to_use, 1});
    }

    void* p = to_use->Allocate(size, tag);
    if (to_relocate != nullptr) {
      RelocateToUsedList(to_relocate);
    }
    return p;
  }